

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall
QMenuPrivate::copyActionToPlatformItem(QMenuPrivate *this,QAction *action,QPlatformMenuItem *item)

{
  long lVar1;
  QWidget *widget;
  undefined1 uVar2;
  char cVar3;
  undefined4 uVar4;
  QStyle *pQVar5;
  long lVar6;
  QMenu *pQVar7;
  QPlatformMenu *pQVar8;
  long in_FS_OFFSET;
  QStyleOption opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QAction::text();
  (**(code **)(*(long *)item + 0x70))(item,&opt);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&opt);
  uVar2 = QAction::isSeparator();
  (**(code **)(*(long *)item + 0x90))(item,uVar2);
  cVar3 = QAction::isIconVisibleInMenu();
  if (cVar3 == '\0') {
    QIcon::QIcon((QIcon *)&opt);
    (**(code **)(*(long *)item + 0x78))(item,&opt);
    QIcon::~QIcon((QIcon *)&opt);
  }
  else {
    QAction::icon();
    (**(code **)(*(long *)item + 0x78))(item,&opt);
    QIcon::~QIcon((QIcon *)&opt);
    lVar6 = *(long *)(action + 8);
    do {
      widget = *(QWidget **)(lVar6 + 0x10);
      if (widget == (QWidget *)0x0) {
        opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
        opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QStyleOption::QStyleOption(&opt,1,0);
        pQVar5 = QApplication::style();
        uVar4 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x3e,&opt,0);
        (**(code **)(*(long *)item + 200))(item,uVar4);
        goto LAB_0041ee4b;
      }
      lVar6 = *(long *)&widget->field_0x8;
    } while ((*(byte *)(lVar6 + 0x30) & 1) == 0);
    opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption(&opt,1,0);
    QStyleOption::initFrom(&opt,widget);
    pQVar5 = QWidget::style(widget);
    uVar4 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x3e,&opt,widget);
    (**(code **)(*(long *)item + 200))(item,uVar4);
LAB_0041ee4b:
    QStyleOption::~QStyleOption(&opt);
  }
  uVar2 = QAction::isVisible();
  (**(code **)(*(long *)item + 0x88))(item,uVar2);
  QAction::shortcut();
  (**(code **)(*(long *)item + 0xb8))(item,&opt);
  QKeySequence::~QKeySequence((QKeySequence *)&opt);
  uVar2 = QAction::isCheckable();
  (**(code **)(*(long *)item + 0xa8))(item,uVar2);
  uVar2 = QAction::isChecked();
  (**(code **)(*(long *)item + 0xb0))(item,uVar2);
  lVar6 = QAction::actionGroup();
  if (lVar6 == 0) {
    uVar2 = 0;
  }
  else {
    QAction::actionGroup();
    uVar2 = QActionGroup::isExclusive();
  }
  (**(code **)(*(long *)item + 0xd8))(item,uVar2);
  QAction::font();
  (**(code **)(*(long *)item + 0x98))(item,&opt);
  QFont::~QFont((QFont *)&opt);
  uVar4 = QAction::menuRole();
  (**(code **)(*(long *)item + 0xa0))(item,uVar4);
  uVar2 = QAction::isEnabled();
  (**(code **)(*(long *)item + 0xc0))(item,uVar2);
  pQVar7 = QAction::menu<QMenu*>(action);
  if (pQVar7 == (QMenu *)0x0) {
    pQVar8 = (QPlatformMenu *)0x0;
  }
  else {
    pQVar7 = QAction::menu<QMenu*>(action);
    pQVar8 = QMenu::platformMenu(pQVar7);
    if (pQVar8 == (QPlatformMenu *)0x0) {
      pQVar7 = QAction::menu<QMenu*>(action);
      pQVar8 = (QPlatformMenu *)(**(code **)(*(long *)(this->platformMenu).wp.value + 0xf8))();
      QMenu::setPlatformMenu(pQVar7,pQVar8);
    }
    pQVar7 = QAction::menu<QMenu*>(action);
    pQVar8 = QMenu::platformMenu(pQVar7);
  }
  (**(code **)(*(long *)item + 0x80))(item,pQVar8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::copyActionToPlatformItem(const QAction *action, QPlatformMenuItem *item)
{
    item->setText(action->text());
    item->setIsSeparator(action->isSeparator());
    if (action->isIconVisibleInMenu()) {
        item->setIcon(action->icon());
        if (QWidget *w = getParentWidget(action)) {
            QStyleOption opt;
            opt.initFrom(w);
            item->setIconSize(w->style()->pixelMetric(QStyle::PM_SmallIconSize, &opt, w));
        } else {
            QStyleOption opt;
            item->setIconSize(QApplication::style()->pixelMetric(QStyle::PM_SmallIconSize, &opt, nullptr));
        }
    } else {
        item->setIcon(QIcon());
    }
    item->setVisible(action->isVisible());
#if QT_CONFIG(shortcut)
    item->setShortcut(action->shortcut());
#endif
    item->setCheckable(action->isCheckable());
    item->setChecked(action->isChecked());
    item->setHasExclusiveGroup(action->actionGroup() && action->actionGroup()->isExclusive());
    item->setFont(action->font());
    item->setRole((QPlatformMenuItem::MenuRole) action->menuRole());
    item->setEnabled(action->isEnabled());

    if (action->menu()) {
        if (!action->menu()->platformMenu())
            action->menu()->setPlatformMenu(platformMenu->createSubMenu());
        item->setMenu(action->menu()->platformMenu());
    } else {
        item->setMenu(nullptr);
    }
}